

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_221fc60::IFFT2DTest_Correctness_Test::TestBody(IFFT2DTest_Correctness_Test *this)

{
  float *pfVar1;
  ParamType *pPVar2;
  int n_00;
  int iVar3;
  int iVar4;
  ulong uVar5;
  SEARCH_METHODS *pSVar6;
  int iVar7;
  int iVar8;
  int n;
  vector<float,_std::allocator<float>_> expected;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> input_c;
  vector<float,_std::allocator<float>_> actual;
  int iVar9;
  internal in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff61;
  pointer in_stack_ffffffffffffff68;
  pointer abs_error_expr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  pointer in_stack_ffffffffffffff88;
  pointer in_stack_ffffffffffffff90;
  int iVar10;
  undefined4 in_stack_ffffffffffffff9c;
  char local_50;
  undefined8 *local_48;
  AssertHelper local_38;
  
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::IFFTTestArg>::GetParam();
  n_00 = pPVar2->n;
  iVar10 = 2;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)&stack0xffffffffffffff60,"n","2",(int *)&stack0xffffffffffffff58,
             (int *)&stack0xffffffffffffff98);
  if (in_stack_ffffffffffffff60 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    if (in_stack_ffffffffffffff68 == (pointer)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = *(SEARCH_METHODS **)in_stack_ffffffffffffff68;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/fft_test.cc"
               ,0xcd,(char *)pSVar6);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)CONCAT44(in_stack_ffffffffffffff9c,iVar10) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff9c,iVar10) + 8))();
    }
    if (in_stack_ffffffffffffff68 == (pointer)0x0) {
      return;
    }
    if (*(pointer *)in_stack_ffffffffffffff68 != in_stack_ffffffffffffff68 + 4) {
      operator_delete(*(pointer *)in_stack_ffffffffffffff68);
    }
  }
  else {
    abs_error_expr = in_stack_ffffffffffffff68;
    if (in_stack_ffffffffffffff68 != (pointer)0x0) {
      if (*(pointer *)in_stack_ffffffffffffff68 != in_stack_ffffffffffffff68 + 4) {
        operator_delete(*(pointer *)in_stack_ffffffffffffff68);
      }
      operator_delete(in_stack_ffffffffffffff68);
    }
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffff60,
               (ulong)(uint)(n_00 * n_00),(allocator_type *)&stack0xffffffffffffff98);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffff98,
               (ulong)(uint)(n_00 * n_00),(allocator_type *)&local_80);
    if (0 < n_00) {
      iVar7 = 0;
      iVar9 = n_00;
      do {
        if (0 < n_00) {
          iVar4 = 0;
          do {
            ((float *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60))
            [n_00 * iVar7 + iVar4] = 1.0;
            fft2d<float>((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                         &local_80,
                         (float *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),n_00
                        );
            if (iVar9 != 0) {
              pfVar1 = (this->super_IFFT2DTest).input_;
              uVar5 = 0;
              do {
                pfVar1[uVar5 * 2] = (float)(&(local_80.data_)->type)[uVar5 * 2];
                pfVar1[uVar5 * 2 + 1] = *(float *)(&(local_80.data_)->field_0x4 + uVar5 * 8);
                uVar5 = uVar5 + 1;
              } while (iVar9 * iVar9 + (uint)(iVar9 * iVar9 == 0) != uVar5);
            }
            pPVar2 = testing::WithParamInterface<(anonymous_namespace)::IFFTTestArg>::GetParam();
            n_00 = iVar9;
            (*pPVar2->ifft)((this->super_IFFT2DTest).input_,(this->super_IFFT2DTest).temp_,
                            (this->super_IFFT2DTest).output_);
            iVar9 = n_00;
            if (0 < n_00) {
              iVar8 = 0;
              do {
                if (0 < n_00) {
                  iVar3 = 0;
                  n_00 = iVar9;
                  do {
                    testing::internal::DoubleNearPredFormat
                              ((char *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60)
                               ,(char *)CONCAT44(iVar4,n_00),(char *)abs_error_expr,
                               (double)CONCAT44(in_stack_ffffffffffffff9c,iVar10),
                               (double)in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88);
                    if (local_50 == '\0') {
                      testing::Message::Message((Message *)&local_88);
                      pSVar6 = "";
                      if (local_48 != (undefined8 *)0x0) {
                        pSVar6 = (SEARCH_METHODS *)*local_48;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_38,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/fft_test.cc"
                                 ,0xde,(char *)pSVar6);
                      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_88);
                      testing::internal::AssertHelper::~AssertHelper(&local_38);
                      if (local_88._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_88._M_head_impl + 8))();
                      }
                    }
                    if (local_48 != (undefined8 *)0x0) {
                      if ((undefined8 *)*local_48 != local_48 + 2) {
                        operator_delete((undefined8 *)*local_48);
                      }
                      operator_delete(local_48);
                    }
                    iVar3 = iVar3 + 1;
                    iVar9 = n_00;
                  } while (iVar3 < n_00);
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < n_00);
            }
            *(undefined4 *)
             (CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60) +
             (long)(n_00 * iVar7 + iVar4) * 4) = 0;
            if (local_80.data_ != (AssertHelperData *)0x0) {
              n_00 = iVar9;
              operator_delete(local_80.data_);
              iVar9 = n_00;
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 < n_00);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < n_00);
    }
    if ((void *)CONCAT44(in_stack_ffffffffffffff9c,iVar10) != (void *)0x0) {
      operator_delete((void *)CONCAT44(in_stack_ffffffffffffff9c,iVar10));
    }
    in_stack_ffffffffffffff68 =
         (pointer)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60);
    if (in_stack_ffffffffffffff68 == (pointer)0x0) {
      return;
    }
  }
  operator_delete(in_stack_ffffffffffffff68);
  return;
}

Assistant:

TEST_P(IFFT2DTest, Correctness) {
  int n = GetParam().n;
  ASSERT_GE(n, 2);
  std::vector<float> expected(n * n);
  std::vector<float> actual(n * n);
  // Do forward transform then invert to make sure we get back expected
  for (int y = 0; y < n; ++y) {
    for (int x = 0; x < n; ++x) {
      expected[y * n + x] = 1;
      std::vector<std::complex<float> > input_c = fft2d(&expected[0], n);
      for (int i = 0; i < n * n; ++i) {
        input_[2 * i + 0] = input_c[i].real();
        input_[2 * i + 1] = input_c[i].imag();
      }
      GetParam().ifft(&input_[0], &temp_[0], &output_[0]);

      for (int yy = 0; yy < n; ++yy) {
        for (int xx = 0; xx < n; ++xx) {
          EXPECT_NEAR(expected[yy * n + xx], output_[yy * n + xx] / (n * n),
                      1e-5);
        }
      }
      expected[y * n + x] = 0;
    }
  }
}